

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CreateFunc(sqlite3 *db,char *zFunctionName,int nArg,int enc,void *pUserData,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,FuncDestructor *pDestructor)

{
  uint nName;
  int iVar1;
  FuncDef *pFVar2;
  ulong local_38;
  
  if (((zFunctionName != (char *)0x0) &&
      ((xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
       (xStep == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
        xFinal == (_func_void_sqlite3_context_ptr *)0x0)))) &&
     ((xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
      ((xFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
       (xFinal == (_func_void_sqlite3_context_ptr *)0x0)))))) {
    if ((0xffffff7e < nArg - 0x80U) &&
       ((xStep == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
         (xFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
         xFinal != (_func_void_sqlite3_context_ptr *)0x0) &&
        (nName = sqlite3Strlen30(zFunctionName), nName < 0x100)))) {
      if (enc == 4) {
        enc = 2;
      }
      else if (enc == 5) {
        iVar1 = sqlite3CreateFunc(db,zFunctionName,nArg,1,pUserData,xFunc,xStep,xFinal,pDestructor);
        if (iVar1 != 0) {
          return iVar1;
        }
        iVar1 = sqlite3CreateFunc(db,zFunctionName,nArg,2,pUserData,xFunc,xStep,xFinal,pDestructor);
        if (iVar1 != 0) {
          return iVar1;
        }
        enc = 3;
      }
      local_38 = CONCAT44(enc,nName) & 0xffffffffff;
      pFVar2 = sqlite3FindFunction(db,zFunctionName,nName,nArg,(u8)enc,'\0');
      if (((pFVar2 != (FuncDef *)0x0) && (enc == (uint)pFVar2->iPrefEnc)) && (pFVar2->nArg == nArg))
      {
        if (db->activeVdbeCnt != 0) {
          sqlite3Error(db,5,"unable to delete/modify user-function due to active statements");
          return 5;
        }
        sqlite3ExpirePreparedStatements(db);
      }
      pFVar2 = sqlite3FindFunction(db,zFunctionName,(int)local_38,nArg,(u8)(local_38 >> 0x20),'\x01'
                                  );
      if (pFVar2 == (FuncDef *)0x0) {
        return 7;
      }
      functionDestroy(db,pFVar2);
      if (pDestructor != (FuncDestructor *)0x0) {
        pDestructor->nRef = pDestructor->nRef + 1;
      }
      pFVar2->pDestructor = pDestructor;
      pFVar2->flags = '\0';
      pFVar2->xFunc = xFunc;
      pFVar2->xStep = xStep;
      pFVar2->xFinalize = xFinal;
      pFVar2->pUserData = pUserData;
      pFVar2->nArg = (i16)nArg;
      return 0;
    }
  }
  sqlite3MisuseError(0x1c5ae);
  return 0x15;
}

Assistant:

SQLITE_PRIVATE int sqlite3CreateFunc(
  sqlite3 *db,
  const char *zFunctionName,
  int nArg,
  int enc,
  void *pUserData,
  void (*xFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  FuncDestructor *pDestructor
){
  FuncDef *p;
  int nName;

  assert( sqlite3_mutex_held(db->mutex) );
  if( zFunctionName==0 ||
      (xFunc && (xFinal || xStep)) || 
      (!xFunc && (xFinal && !xStep)) ||
      (!xFunc && (!xFinal && xStep)) ||
      (nArg<-1 || nArg>SQLITE_MAX_FUNCTION_ARG) ||
      (255<(nName = sqlite3Strlen30( zFunctionName))) ){
    return SQLITE_MISUSE_BKPT;
  }
  
#ifndef SQLITE_OMIT_UTF16
  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  **
  ** If SQLITE_ANY is specified, add three versions of the function
  ** to the hash table.
  */
  if( enc==SQLITE_UTF16 ){
    enc = SQLITE_UTF16NATIVE;
  }else if( enc==SQLITE_ANY ){
    int rc;
    rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF8,
         pUserData, xFunc, xStep, xFinal, pDestructor);
    if( rc==SQLITE_OK ){
      rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF16LE,
          pUserData, xFunc, xStep, xFinal, pDestructor);
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    enc = SQLITE_UTF16BE;
  }
#else
  enc = SQLITE_UTF8;
#endif
  
  /* Check if an existing function is being overridden or deleted. If so,
  ** and there are active VMs, then return SQLITE_BUSY. If a function
  ** is being overridden/deleted but there are no active VMs, allow the
  ** operation to continue but invalidate all precompiled statements.
  */
  p = sqlite3FindFunction(db, zFunctionName, nName, nArg, (u8)enc, 0);
  if( p && p->iPrefEnc==enc && p->nArg==nArg ){
    if( db->activeVdbeCnt ){
      sqlite3Error(db, SQLITE_BUSY, 
        "unable to delete/modify user-function due to active statements");
      assert( !db->mallocFailed );
      return SQLITE_BUSY;
    }else{
      sqlite3ExpirePreparedStatements(db);
    }
  }

  p = sqlite3FindFunction(db, zFunctionName, nName, nArg, (u8)enc, 1);
  assert(p || db->mallocFailed);
  if( !p ){
    return SQLITE_NOMEM;
  }

  /* If an older version of the function with a configured destructor is
  ** being replaced invoke the destructor function here. */
  functionDestroy(db, p);

  if( pDestructor ){
    pDestructor->nRef++;
  }
  p->pDestructor = pDestructor;
  p->flags = 0;
  p->xFunc = xFunc;
  p->xStep = xStep;
  p->xFinalize = xFinal;
  p->pUserData = pUserData;
  p->nArg = (u16)nArg;
  return SQLITE_OK;
}